

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.cpp
# Opt level: O2

void __thiscall blc::tools::pipe::waitWrite(pipe *this,int usec)

{
  int iVar1;
  long in_RAX;
  duration<long,_std::ratio<1L,_1000000L>_> local_28;
  
  local_28.__r = in_RAX;
  iVar1 = (*(this->super_stream)._vptr_stream[6])();
  if ((char)iVar1 == '\0') {
    while( true ) {
      iVar1 = (*(this->super_stream)._vptr_stream[5])(this);
      if ((char)iVar1 != '\0') break;
      local_28.__r = (long)usec;
      std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>(&local_28);
    }
  }
  return;
}

Assistant:

void blc::tools::pipe::waitWrite(int usec) const {
	if (this->isClosed())
		return;
	while (this->writable() == false) {
		std::this_thread::sleep_for(std::chrono::microseconds(usec));
	}
}